

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_jacob_m(REF_DBL *m_upper_tri,REF_DBL *j)

{
  uint uVar1;
  double dVar2;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double dStack_58;
  double local_50;
  double dStack_48;
  double local_40;
  double dStack_38;
  double local_30;
  double dStack_28;
  double local_20;
  
  uVar1 = ref_matrix_diag_m(m_upper_tri,&local_78);
  if (uVar1 == 0) {
    if (local_78 < 0.0) {
      dVar2 = sqrt(local_78);
    }
    else {
      dVar2 = SQRT(local_78);
    }
    if (local_70 < 0.0) {
      local_70 = sqrt(local_70);
    }
    else {
      local_70 = SQRT(local_70);
    }
    if (local_68 < 0.0) {
      local_68 = sqrt(local_68);
    }
    else {
      local_68 = SQRT(local_68);
    }
    *j = dVar2 * local_60;
    j[1] = dVar2 * dStack_58;
    j[2] = dVar2 * local_50;
    j[3] = local_70 * dStack_48;
    j[4] = local_70 * local_40;
    j[5] = local_70 * dStack_38;
    j[6] = local_68 * local_30;
    j[7] = local_68 * dStack_28;
    j[8] = local_68 * local_20;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x1c0,
           "ref_matrix_jacob_m",(ulong)uVar1,"diag");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_jacob_m(REF_DBL *m_upper_tri, REF_DBL *j) {
  REF_DBL d[12];

  RSS(ref_matrix_diag_m(m_upper_tri, d), "diag");

  d[0] = sqrt(d[0]);
  d[1] = sqrt(d[1]);
  d[2] = sqrt(d[2]);

  j[0] = ref_matrix_eig(d, 0) * ref_matrix_vec(d, 0, 0);
  j[1] = ref_matrix_eig(d, 0) * ref_matrix_vec(d, 1, 0);
  j[2] = ref_matrix_eig(d, 0) * ref_matrix_vec(d, 2, 0);

  j[3] = ref_matrix_eig(d, 1) * ref_matrix_vec(d, 0, 1);
  j[4] = ref_matrix_eig(d, 1) * ref_matrix_vec(d, 1, 1);
  j[5] = ref_matrix_eig(d, 1) * ref_matrix_vec(d, 2, 1);

  j[6] = ref_matrix_eig(d, 2) * ref_matrix_vec(d, 0, 2);
  j[7] = ref_matrix_eig(d, 2) * ref_matrix_vec(d, 1, 2);
  j[8] = ref_matrix_eig(d, 2) * ref_matrix_vec(d, 2, 2);

  return REF_SUCCESS;
}